

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O2

int __thiscall ninx::parser::TokenReader::check_limiter(TokenReader *this,char limiter)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Token *pTVar4;
  Limiter *this_00;
  
  pTVar4 = peek_token(this);
  if (pTVar4 == (Token *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    iVar2 = (*pTVar4->_vptr_Token[2])(pTVar4);
    uVar3 = 0;
    if (iVar2 == 1) {
      this_00 = (Limiter *)
                __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,
                               &lexer::token::Limiter::typeinfo,0);
      cVar1 = lexer::token::Limiter::get_limiter(this_00);
      uVar3 = (uint)(cVar1 == limiter);
    }
  }
  return uVar3;
}

Assistant:

int ninx::parser::TokenReader::check_limiter(char limiter) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    if (token->get_type() != Type::LIMITER) {
        return 0;
    }

    if (dynamic_cast<ninx::lexer::token::Limiter*>(token)->get_limiter() == limiter) {
        return 1;
    }

    return 0;
}